

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

int Col_TraverseRopeChunks
              (Col_Word rope,size_t start,size_t max,int reverse,Col_RopeChunksTraverseProc *proc,
              Col_ClientData clientData,size_t *lengthPtr)

{
  ushort uVar1;
  undefined8 data;
  size_t sVar2;
  byte bVar3;
  Col_Char1 *pCVar4;
  long lVar5;
  Col_Char2 *pCVar6;
  size_t sVar7;
  long *plVar8;
  long local_108;
  Col_RopeChunk local_100;
  size_t local_e8;
  long local_e0;
  Col_RopeChunk local_d8;
  size_t local_c0;
  ulong local_b8;
  undefined1 *local_b0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  size_t local_98;
  size_t ropeLength;
  undefined1 local_88 [4];
  int result;
  Col_RopeChunk chunk;
  RopeChunkTraverseInfo info;
  Col_ClientData clientData_local;
  Col_RopeChunksTraverseProc *proc_local;
  size_t sStack_28;
  int reverse_local;
  size_t max_local;
  size_t start_local;
  Col_Word rope_local;
  
  plVar8 = &local_108;
  if (proc == (Col_RopeChunksTraverseProc *)0x0) {
    Col_Error(COL_VALUECHECK,ColibriDomain,0);
    rope_local._4_4_ = -1;
  }
  else {
    if (rope == 0) {
      local_9c = 0;
    }
    else {
      if ((rope & 0xf) == 0) {
        if ((*(byte *)rope & 2) == 0) {
          local_a4 = 0xffffffff;
        }
        else {
          local_a4 = *(byte *)rope & 0xfffffffe;
        }
        local_a0 = local_a4;
      }
      else {
        local_a0 = immediateWordTypes[rope & 0x1f];
      }
      local_9c = local_a0;
    }
    start_local = rope;
    if ((local_9c == 2) && ((*(ushort *)(rope + 2) & 0xc) == 0)) {
      start_local = *(size_t *)(rope + 0x10);
    }
    local_98 = Col_RopeLength(start_local);
    if (local_98 == 0) {
      rope_local._4_4_ = -1;
    }
    else {
      sStack_28 = max;
      max_local = start;
      if (reverse == 0) {
        if (local_98 <= start) {
          return -1;
        }
        if (local_98 - start < max) {
          sStack_28 = local_98 - start;
        }
      }
      else {
        if (local_98 <= start) {
          max_local = local_98 - 1;
        }
        if (max_local + 1 < max) {
          sStack_28 = max_local + 1;
        }
      }
      sVar2 = max_local;
      if (sStack_28 == 0) {
        rope_local._4_4_ = -1;
      }
      else {
        bVar3 = GetDepth(start_local);
        if (bVar3 == 0) {
          local_b0 = (undefined1 *)0x0;
        }
        else {
          plVar8 = (long *)((long)&local_108 -
                           ((long)(int)(uint)bVar3 * 0x18 + 0xfU & 0xfffffffffffffff0));
          local_b0 = (undefined1 *)plVar8;
        }
        chunk.byteLength = (size_t)local_b0;
        do {
          *(undefined8 *)((long)plVar8 + -8) = 0x10bed8;
          GetChunk((RopeChunkTraverseInfo *)&chunk.byteLength,(Col_RopeChunk *)local_88,reverse);
          data = chunk._0_8_;
          local_b8 = (ulong)((int)local_88 - COL_UCS1);
          switch(local_b8) {
          case 0:
          case 1:
          case 3:
            chunk.data = (void *)(sStack_28 * ((uint)local_88 & (COL_UCS4|COL_UCS2|COL_UCS1)));
            break;
          case 0x10:
            local_d8.format = chunk.format;
            local_d8._4_4_ = chunk._4_4_;
            local_d8.data = (void *)sStack_28;
            local_d8.byteLength = (size_t)*(ushort *)(start_local + 2);
            local_c0 = sVar2;
            if (reverse == 0) {
              local_e0 = 0;
            }
            else {
              local_e0 = sStack_28 - 1;
            }
            sVar7 = local_d8.byteLength - (sVar2 - local_e0);
            uVar1 = *(ushort *)(start_local + 4);
            lVar5 = chunk._0_8_ - (start_local + 6);
            *(undefined8 *)((long)plVar8 + -8) = 0x10bfc3;
            pCVar4 = Col_Utf8Addr((Col_Char1 *)data,sStack_28,sVar7,(ulong)uVar1 - lVar5);
            chunk.data = pCVar4 + -chunk._0_8_;
            break;
          case 0x11:
            local_100.format = chunk.format;
            local_100._4_4_ = chunk._4_4_;
            local_100.data = (void *)sStack_28;
            local_100.byteLength = (size_t)*(ushort *)(start_local + 2);
            local_e8 = sVar2;
            if (reverse == 0) {
              local_108 = 0;
            }
            else {
              local_108 = sStack_28 - 1;
            }
            sVar7 = local_100.byteLength - (sVar2 - local_108);
            uVar1 = *(ushort *)(start_local + 4);
            lVar5 = chunk._0_8_ - (start_local + 6);
            *(undefined8 *)((long)plVar8 + -8) = 0x10c06f;
            pCVar6 = Col_Utf16Addr((Col_Char2 *)data,sStack_28,sVar7,(ulong)uVar1 - lVar5);
            chunk.data = (void *)((long)pCVar6 - chunk._0_8_);
          }
          if (lengthPtr != (size_t *)0x0) {
            *lengthPtr = sStack_28 + *lengthPtr;
          }
          if (reverse == 0) {
            *(undefined8 *)((long)plVar8 + -8) = 0x10c0ea;
            ropeLength._4_4_ = (*proc)(max_local,sStack_28,1,(Col_RopeChunk *)local_88,clientData);
            sVar7 = sStack_28;
          }
          else {
            *(undefined8 *)((long)plVar8 + -8) = 0x10c0b8;
            ropeLength._4_4_ =
                 (*proc)((max_local - sStack_28) + 1,sStack_28,1,(Col_RopeChunk *)local_88,
                         clientData);
            sVar7 = -sStack_28;
          }
          max_local = max_local + sVar7;
          if (ropeLength._4_4_ != 0) {
            return ropeLength._4_4_;
          }
          *(undefined8 *)((long)plVar8 + -8) = 0x10c120;
          NextChunk((RopeChunkTraverseInfo *)&chunk.byteLength,sStack_28,reverse);
        } while (start_local != 0);
        rope_local._4_4_ = 0;
      }
    }
  }
  return rope_local._4_4_;
}

Assistant:

int
Col_TraverseRopeChunks(
    Col_Word rope,                      /*!< Rope to traverse. */
    size_t start,                       /*!< Index of first character. */
    size_t max,                         /*!< Max number of characters. */
    int reverse,                        /*!< Whether to traverse in reverse
                                             order. */
    Col_RopeChunksTraverseProc *proc,   /*!< Callback proc called on each
                                             chunk. */
    Col_ClientData clientData,          /*!< Opaque data passed as is to above
                                             **proc**. */

    /*! [in,out] If non-NULL, incremented by the total number of characters
                 traversed upon completion. */
    size_t *lengthPtr)
{
    RopeChunkTraverseInfo info;
    Col_RopeChunk chunk;
    int result;
    size_t ropeLength;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPE,rope} */
    TYPECHECK_ROPE(rope) return -1;

    /*! @valuecheck{COL_ERROR_GENERIC,proc == NULL} */
    VALUECHECK(proc != NULL, COL_ERROR_GENERIC) return -1;

    WORD_UNWRAP(rope);

    ropeLength = Col_RopeLength(rope);
    if (ropeLength == 0) {
        /*
         * Nothing to traverse.
         */

        return -1;
    }

    if (reverse) {
        if (start >= ropeLength) {
            /*
             * Start is past the end of the rope.
             */

            start = ropeLength-1;
        }
        if (max > start+1) {
            /*
             * Adjust max to the remaining length.
             */

            max = start+1;
        }
    } else {
        if (start >= ropeLength) {
            /*
             * Start is past the end of the rope.
             */

            return -1;
        }
        if (max > ropeLength-start) {
            /*
             * Adjust max to the remaining length.
             */

            max = ropeLength-start;
        }
    }

    if (max == 0) {
        /*
         * Nothing to traverse.
         */

        return -1;
    }

    info.rope = rope;
    info.start = start;
    info.max = max;
    info.maxDepth = GetDepth(rope);
    info.backtracks = (info.maxDepth ?
            alloca(sizeof(*info.backtracks) * info.maxDepth) : NULL);
    info.prevDepth = INT_MAX;

    for (;;) {
        GetChunk(&info, &chunk, reverse);
        max = info.max;

        /*
         * Compute actual byte length.
         */

        switch (chunk.format) {
        case COL_UCS1:
        case COL_UCS2:
        case COL_UCS4:
            chunk.byteLength = max * CHAR_WIDTH(chunk.format);
            break;

        case COL_UTF8:
            chunk.byteLength = (const char *) Col_Utf8Addr(
                    (const Col_Char1 *) chunk.data, max, 
                    WORD_UTFSTR_LENGTH(info.rope) 
                    - (info.start - (reverse ? info.max-1 : 0)),
                    WORD_UTFSTR_BYTELENGTH(info.rope)
                    - ((const char *) chunk.data
                    - WORD_UTFSTR_DATA(info.rope)))
                    - (const char *) chunk.data;
            break;

        case COL_UTF16:
            chunk.byteLength = (const char *) Col_Utf16Addr(
                    (const Col_Char2 *) chunk.data, max, 
                    WORD_UTFSTR_LENGTH(info.rope) 
                    - (info.start - (reverse ? info.max-1 : 0)),
                    WORD_UTFSTR_BYTELENGTH(info.rope)
                    - ((const char *) chunk.data
                    - WORD_UTFSTR_DATA(info.rope)))
                    - (const char *) chunk.data;
            break;
        }

        /*
         * Call proc on leaf data.
         */

        if (lengthPtr) *lengthPtr += max;
        if (reverse) {
            result = proc(start-max+1, max, 1, &chunk, clientData);
            start -= max;
        } else {
            result = proc(start, max, 1, &chunk, clientData);
            start += max;
        }
        if (result != 0) {
            /*
             * Stop there.
             */

            return result;
        } else {
            /*
             * Continue iteration.
             */

            NextChunk(&info, max, reverse);
            if (!info.rope) {
                /*
                 * Reached end of rope, stop there.
                 */

                return 0;
            }
        }
    }
}